

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall V2Reverb::set(V2Reverb *this,syVReverb *para)

{
  float fVar1;
  float fVar2;
  int local_24;
  int local_20;
  int i_1;
  int i;
  float e;
  syVReverb *para_local;
  V2Reverb *this_local;
  
  fVar2 = this->inst->SRfclinfreq;
  fVar1 = sqr(64.0 / (para->revtime + 1.0));
  fVar2 = fVar2 * fVar1;
  for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
    fVar1 = powf(set::gaincdef[local_20],fVar2);
    this->gainc[local_20] = fVar1;
  }
  for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
    fVar1 = powf(set::gainadef[local_24],fVar2);
    this->gaina[local_24] = fVar1;
  }
  this->damp = this->inst->SRfclinfreq * (para->highcut / 128.0);
  this->gainin = para->vol / 128.0;
  fVar2 = this->inst->SRfclinfreq;
  fVar1 = sqr(para->lowcut / 128.0);
  fVar1 = sqr(fVar1);
  this->lowcut = fVar2 * fVar1;
  return;
}

Assistant:

void set(const syVReverb *para)
    {
        static const float gaincdef[4] = {
            0.966384599f, 0.958186359f, 0.953783929f, 0.950933178f
        };
        static const float gainadef[2] = {
            0.994260075f, 0.998044717f
        };

        float e = inst->SRfclinfreq * sqr(64.0f / (para->revtime + 1.0f));
        for (int i=0; i < 4; i++)
            gainc[i] = powf(gaincdef[i], e);

        for (int i=0; i < 2; i++)
            gaina[i] = powf(gainadef[i], e);

        damp = inst->SRfclinfreq * (para->highcut / 128.0f);
        gainin = para->vol / 128.0f;
        lowcut = inst->SRfclinfreq * sqr(sqr(para->lowcut / 128.0f));
    }